

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

int get_tok(char *c_orig,char **c,size_t *bsz,size_t *toksz,int *line)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  char *__s1;
  bool bVar8;
  
  sVar6 = *bsz;
  while( true ) {
    while( true ) {
      if (sVar6 == 0) {
        return 0;
      }
      __s1 = *c;
      cVar1 = *__s1;
      if (ws[cVar1] == 0) break;
      if (cVar1 == '\n') {
        *line = *line + 1;
      }
      sVar6 = sVar6 - 1;
      *bsz = sVar6;
      *c = __s1 + 1;
    }
    if (cVar1 != '#') break;
    do {
      __s1 = __s1 + 1;
      bVar8 = sVar6 == 0;
      sVar6 = sVar6 - 1;
      if (bVar8) {
        return 0;
      }
      *c = __s1;
      *bsz = sVar6;
    } while (*__s1 != '\n');
  }
  for (lVar7 = 0; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    uVar5 = kw[lVar7].len;
    if ((uVar5 <= sVar6) && (iVar2 = bcmp(__s1,kw[lVar7].str,uVar5), iVar2 == 0)) {
      uVar3 = kw[lVar7].id;
      pcVar4 = __s1;
      if ((0x18 < uVar3) || ((0x10000a4U >> (uVar3 & 0x1f) & 1) == 0)) {
        while ((pcVar4 = pcVar4 + -1, c_orig < pcVar4 && ((long)*pcVar4 != 10))) {
          if (ws[*pcVar4] == 0) goto LAB_00106f58;
        }
      }
      pcVar4 = __s1 + uVar5;
      if (sVar6 <= uVar5) {
        pcVar4 = " ";
      }
      if (ws[*pcVar4] != 0) {
        *toksz = uVar5;
        return uVar3;
      }
    }
  }
LAB_00106f58:
  if (cVar1 == '\"') {
    *toksz = 1;
    uVar5 = 1;
    do {
      if (*bsz <= uVar5) {
        return -1;
      }
      *toksz = uVar5 + 1;
      pcVar4 = __s1 + uVar5;
      if (*pcVar4 == '\n') {
        return -1;
      }
      uVar5 = uVar5 + 1;
    } while (*pcVar4 != '\"');
    uVar3 = 0x1b;
  }
  else {
    uVar5 = 0;
    while ((*toksz = uVar5, uVar5 < *bsz && (ws[__s1[uVar5]] == 0))) {
      uVar5 = uVar5 + 1;
    }
    uVar3 = -(uint)(uVar5 == 0) | 3;
  }
  return uVar3;
}

Assistant:

int get_tok(char *c_orig, char **c, size_t *bsz, size_t *toksz, int *line) {
  char *e;
  int leading_nl=0;

 again:
  /* skip leading whitespace */
  while(*bsz && ws[(int)**c]) {
    if (**c=='\n') { 
      leading_nl=1;
      (*line)++;
    }
    (*bsz)--; (*c)++;
  }
  if (*bsz == 0) return 0; // end of input

  /* disregard comments til end of line */
  if (**c=='#') {
    while (*bsz) {
      (*c)++; (*bsz)--;
      if (**c == '\n') goto again;
    }
    return 0; /* eob while looking for trailing newline */
  }

  /* identify literal keywords */
  int i;
  for(i=0; i < sizeof(kw)/sizeof(*kw); i++) {
    if (*bsz < kw[i].len) continue;
    if (memcmp(*c,kw[i].str,kw[i].len) ) continue;
    /* keywords except "{ on to every" must be preceded by start-of-buf or newline */
    if (kw[i].id != TOK_LCURLY && 
        kw[i].id != TOK_ON     && 
        kw[i].id != TOK_TO     && 
        kw[i].id != TOK_EVERY) {
      for(e=(*c)-1; e > c_orig; e--) {
        if (*e == '\n') break;
        if (ws[(int)*e]) continue;
        /* has non-newline chars preceding, so do not consider as a keyword */
        else goto quoted; 
      }
    }
    /* require keywords to end with space or eob */
    e = (*bsz > kw[i].len) ? (*c + kw[i].len) : " ";
    if (!ws[(int)(*e)]) continue;
    *toksz = kw[i].len;
    return kw[i].id;
  }

 quoted:
  /* identify quoted string that ends with the closing quote on same line */
  if (**c=='"') {
    *toksz=1;
    while (*toksz < *bsz) {
      e = *c + *toksz;
      (*toksz)++;
      if (*e == '"') return TOK_QUOTEDSTR;
      if (*e == '\n') return -1;
    }
    return -1; /* eob without terminating quote */
  }

  /* otherwise its a string ending with end-of-buffer or whitespace */
  *toksz=0; 
  while ((*toksz < *bsz) && (!ws[(int)*(*c+*toksz)])) (*toksz)++;
  if (*toksz) return TOK_STR; 

  return -1;
}